

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O3

void __thiscall
estl::vector_s<unsigned_int,_5UL>::vector_s
          (vector_s<unsigned_int,_5UL> *this,size_type count,uint *value)

{
  long lVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  range_error *this_00;
  char *pcVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  this->size_ = 0;
  this->data_ptr_ = (pointer)this->data_;
  auVar4 = _DAT_00157020;
  auVar3 = _DAT_00157010;
  if (count < 6) {
    if (count != 0) {
      uVar2 = *value;
      lVar1 = count - 1;
      auVar7._8_4_ = (int)lVar1;
      auVar7._0_8_ = lVar1;
      auVar7._12_4_ = (int)((ulong)lVar1 >> 0x20);
      pcVar5 = this->data_ + count * 4 + -4;
      uVar6 = 0;
      auVar7 = auVar7 ^ _DAT_00157020;
      do {
        auVar8._8_4_ = (int)uVar6;
        auVar8._0_8_ = uVar6;
        auVar8._12_4_ = (int)(uVar6 >> 0x20);
        auVar8 = (auVar8 | auVar3) ^ auVar4;
        if ((bool)(~(auVar8._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar8._0_4_ ||
                    auVar7._4_4_ < auVar8._4_4_) & 1)) {
          *(uint *)pcVar5 = uVar2;
        }
        if ((auVar8._12_4_ != auVar7._12_4_ || auVar8._8_4_ <= auVar7._8_4_) &&
            auVar8._12_4_ <= auVar7._12_4_) {
          *(uint *)((long)pcVar5 + 0xfffffffffffffffc) = uVar2;
        }
        uVar6 = uVar6 + 2;
        pcVar5 = (char *)((long)pcVar5 + 0xfffffffffffffff8);
      } while (((int)count + 1U & 0xe) != uVar6);
    }
    this->size_ = count;
    return;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this_00,"cas::vector_s constructing beyond capacity.");
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

vector_s(size_type count, const T& value)
    {
        if (count > capacity()) {
            ESTL_THROW(std::range_error, "cas::vector_s constructing beyond capacity.");
        }
        for (size_t i = count; i > 0; ) {
            --i;
            const pointer insert_ptr = data_ptr_ + i;
            new (insert_ptr) value_type(value);
        }
        size_ = count;
    }